

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
array<CEnvPoint,_allocator_default<CEnvPoint>_>::alloc
          (array<CEnvPoint,_allocator_default<CEnvPoint>_> *this,int new_len)

{
  CEnvPoint *pCVar1;
  undefined1 auVar2 [16];
  int iVar3;
  CEnvPoint *pCVar4;
  long lVar5;
  undefined4 *puVar6;
  ulong uVar7;
  undefined4 *puVar8;
  long lVar9;
  byte bVar10;
  
  bVar10 = 0;
  this->list_size = new_len;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)new_len;
  uVar7 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x58),8) == 0) {
    uVar7 = SUB168(auVar2 * ZEXT816(0x58),0);
  }
  pCVar4 = (CEnvPoint *)operator_new__(uVar7);
  if (this->num_elements < new_len) {
    new_len = this->num_elements;
  }
  if (0 < new_len) {
    pCVar1 = this->list;
    lVar9 = 0;
    do {
      puVar6 = (undefined4 *)((long)(pCVar1->super_CEnvPoint_v1).m_aValues + lVar9 + -8);
      puVar8 = (undefined4 *)((long)(pCVar4->super_CEnvPoint_v1).m_aValues + lVar9 + -8);
      for (lVar5 = 0x16; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar8 = *puVar6;
        puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
        puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
      }
      lVar9 = lVar9 + 0x58;
    } while ((ulong)(uint)new_len * 0x58 - lVar9 != 0);
  }
  if (this->list != (CEnvPoint *)0x0) {
    operator_delete__(this->list);
  }
  iVar3 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar3 = this->num_elements;
  }
  this->num_elements = iVar3;
  this->list = pCVar4;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}